

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sweep_context.cc
# Opt level: O2

void __thiscall p2t::SweepContext::MeshClean(SweepContext *this,Triangle *triangle)

{
  long lVar1;
  Triangle *t;
  vector<p2t::Triangle_*,_std::allocator<p2t::Triangle_*>_> triangles;
  Triangle *local_38;
  
  triangles.super__Vector_base<p2t::Triangle_*,_std::allocator<p2t::Triangle_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  triangles.super__Vector_base<p2t::Triangle_*,_std::allocator<p2t::Triangle_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  triangles.super__Vector_base<p2t::Triangle_*,_std::allocator<p2t::Triangle_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  t = triangle;
  std::vector<p2t::Triangle*,std::allocator<p2t::Triangle*>>::emplace_back<p2t::Triangle*>
            ((vector<p2t::Triangle*,std::allocator<p2t::Triangle*>> *)&triangles,&t);
  while (triangles.super__Vector_base<p2t::Triangle_*,_std::allocator<p2t::Triangle_*>_>._M_impl.
         super__Vector_impl_data._M_start !=
         triangles.super__Vector_base<p2t::Triangle_*,_std::allocator<p2t::Triangle_*>_>._M_impl.
         super__Vector_impl_data._M_finish) {
    t = triangles.super__Vector_base<p2t::Triangle_*,_std::allocator<p2t::Triangle_*>_>._M_impl.
        super__Vector_impl_data._M_finish[-1];
    triangles.super__Vector_base<p2t::Triangle_*,_std::allocator<p2t::Triangle_*>_>._M_impl.
    super__Vector_impl_data._M_finish =
         triangles.super__Vector_base<p2t::Triangle_*,_std::allocator<p2t::Triangle_*>_>._M_impl.
         super__Vector_impl_data._M_finish + -1;
    if ((t != (Triangle *)0x0) && (t->interior_ == false)) {
      t->interior_ = true;
      std::vector<p2t::Triangle_*,_std::allocator<p2t::Triangle_*>_>::push_back
                (&this->triangles_,&t);
      for (lVar1 = 4; lVar1 != 7; lVar1 = lVar1 + 1) {
        if (t->constrained_edge[lVar1 + -4] == false) {
          local_38 = *(Triangle **)(t->constrained_edge + lVar1 * 8);
          std::vector<p2t::Triangle*,std::allocator<p2t::Triangle*>>::emplace_back<p2t::Triangle*>
                    ((vector<p2t::Triangle*,std::allocator<p2t::Triangle*>> *)&triangles,&local_38);
        }
      }
    }
  }
  std::_Vector_base<p2t::Triangle_*,_std::allocator<p2t::Triangle_*>_>::~_Vector_base
            (&triangles.super__Vector_base<p2t::Triangle_*,_std::allocator<p2t::Triangle_*>_>);
  return;
}

Assistant:

void SweepContext::MeshClean(Triangle& triangle)
{
  std::vector<Triangle *> triangles;
  triangles.push_back(&triangle);

  while(!triangles.empty()){
	Triangle *t = triangles.back();
	triangles.pop_back();

    if (t != NULL && !t->IsInterior()) {
      t->IsInterior(true);
      triangles_.push_back(t);
      for (int i = 0; i < 3; i++) {
        if (!t->constrained_edge[i])
          triangles.push_back(t->GetNeighbor(i));
      }
    }
  }
}